

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_basics.cpp
# Opt level: O2

void test_3d_static<30ul,30ul,30ul>(void)

{
  _Head_base<1UL,_int,_false> _Var1;
  _Head_base<2UL,_int,_false> _Var2;
  _Head_base<0UL,_int,_false> _Var3;
  size_type sVar4;
  ulong uVar5;
  _Head_base<1UL,_int,_false> _Stack_4f204;
  _Head_base<2UL,_int,_false> _Stack_4f200;
  _Head_base<0UL,_int,_false> _Stack_4f1fc;
  value_type true_idx;
  tuple<int,_int,_int> *ptStack_4f1f0;
  tuple<int,_int,_int> *ptStack_4f1e8;
  layout_mapping_left<dimensions<30UL,_30UL,_30UL>,_dimensions<1,_1,_1>,_dimensions<0,_0,_0>_> l;
  tuple<int,_int,_int> dptr [27000];
  
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x106,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",(bool *)dptr,
             (bool *)&true_idx);
  true_idx = true_idx & 0xffffffffffffff00;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(0))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x108,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",(bool *)dptr,
             (bool *)&true_idx);
  true_idx = true_idx & 0xffffffffffffff00;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(1))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x109,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",(bool *)dptr,
             (bool *)&true_idx);
  true_idx = true_idx & 0xffffffffffffff00;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_dynamic_stride(2))","false",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10a,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",(bool *)dptr,
             (bool *)&true_idx);
  true_idx = CONCAT44(true_idx._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10c,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",(unsigned_long *)dptr,
             (int *)&true_idx);
  true_idx = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(1))","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10d,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",(unsigned_long *)dptr,
             &true_idx);
  true_idx = 900;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.stride(2))","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x10e,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",(unsigned_long *)dptr,
             &true_idx);
  true_idx = 27000;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y * Z",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x110,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",(unsigned_long *)dptr,
             &true_idx);
  true_idx = 27000;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X * Y * Z",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
             ,0x111,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",(unsigned_long *)dptr,
             &true_idx);
  memset(dptr,0,0x4f1a0);
  for (_Stack_4f200._M_head_impl = 0; (uint)_Stack_4f200._M_head_impl < 0x1e;
      _Stack_4f200._M_head_impl = _Stack_4f200._M_head_impl + 1) {
    for (_Stack_4f204._M_head_impl = 0; (uint)_Stack_4f204._M_head_impl < 0x1e;
        _Stack_4f204._M_head_impl = _Stack_4f204._M_head_impl + 1) {
      uVar5 = 0;
      while( true ) {
        _Stack_4f1fc._M_head_impl = (int)uVar5;
        if (0x1d < (uint)_Stack_4f1fc._M_head_impl) break;
        true_idx = (long)_Stack_4f200._M_head_impl * 900 +
                   (long)_Stack_4f204._M_head_impl * 0x1e + uVar5;
        ptStack_4f1f0 =
             (tuple<int,_int,_int> *)
             std::experimental::
             layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
             ::index<int,int,int>
                       ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                         *)&l,_Stack_4f1fc._M_head_impl,_Stack_4f204._M_head_impl,
                        _Stack_4f200._M_head_impl);
        boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                  ("(l.index(i, j, k))","true_idx",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x11c,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",
                   (unsigned_long *)&ptStack_4f1f0,&true_idx);
        sVar4 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,_Stack_4f1fc._M_head_impl,_Stack_4f204._M_head_impl,
                           _Stack_4f200._M_head_impl);
        ptStack_4f1f0 = dptr + sVar4;
        ptStack_4f1e8 = dptr + true_idx;
        boost::detail::test_eq_impl<std::tuple<int,int,int>*,std::tuple<int,int,int>*>
                  ("&(dptr[l.index(i, j, k)])","&(dptr[true_idx])",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x11e,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",&ptStack_4f1f0,
                   &ptStack_4f1e8);
        _Var3._M_head_impl = _Stack_4f1fc._M_head_impl;
        sVar4 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,_Stack_4f1fc._M_head_impl,_Stack_4f204._M_head_impl,
                           _Stack_4f200._M_head_impl);
        _Var1._M_head_impl = _Stack_4f204._M_head_impl;
        dptr[sVar4].super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
        _M_head_impl = _Var3._M_head_impl;
        sVar4 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,_Stack_4f1fc._M_head_impl,_Stack_4f204._M_head_impl,
                           _Stack_4f200._M_head_impl);
        _Var2._M_head_impl = _Stack_4f200._M_head_impl;
        dptr[sVar4].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Head_base<1UL,_int,_false>._M_head_impl = _Var1._M_head_impl;
        sVar4 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,_Stack_4f1fc._M_head_impl,_Stack_4f204._M_head_impl,
                           _Stack_4f200._M_head_impl);
        dptr[sVar4].super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
        super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
             _Var2._M_head_impl;
        sVar4 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,_Stack_4f1fc._M_head_impl,_Stack_4f204._M_head_impl,
                           _Stack_4f200._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<0>(dptr[l.index(i, j, k)]))","i",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x124,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",
                   &dptr[sVar4].super__Tuple_impl<0UL,_int,_int,_int>.
                    super__Head_base<0UL,_int,_false>._M_head_impl,&_Stack_4f1fc._M_head_impl);
        sVar4 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,_Stack_4f1fc._M_head_impl,_Stack_4f204._M_head_impl,
                           _Stack_4f200._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<1>(dptr[l.index(i, j, k)]))","j",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x125,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",
                   &dptr[sVar4].super__Tuple_impl<0UL,_int,_int,_int>.
                    super__Tuple_impl<1UL,_int,_int>.super__Head_base<1UL,_int,_false>._M_head_impl,
                   &_Stack_4f204._M_head_impl);
        sVar4 = std::experimental::
                layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                ::index<int,int,int>
                          ((layout_mapping_regular_precomputed_strides<std::experimental::dimensions<30ul,30ul,30ul>,std::experimental::dimensions<1ul,1ul,1ul>,std::experimental::dimensions<0ul,0ul,0ul>,std::experimental::detail::integer_sequence<unsigned_long,0ul,1ul,2ul>>
                            *)&l,_Stack_4f1fc._M_head_impl,_Stack_4f204._M_head_impl,
                           _Stack_4f200._M_head_impl);
        boost::detail::test_eq_impl<int,int>
                  ("(std::get<2>(dptr[l.index(i, j, k)]))","k",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_basics.cpp"
                   ,0x126,"void test_3d_static() [X = 30UL, Y = 30UL, Z = 30UL]",
                   (int *)(dptr + sVar4),&_Stack_4f200._M_head_impl);
        uVar5 = (ulong)(_Stack_4f1fc._M_head_impl + 1);
      }
    }
  }
  return;
}

Assistant:

void test_3d_static()
{ // {{{
    layout_mapping_left<
        dimensions<X, Y, Z>, dimensions<1, 1, 1>, dimensions<0, 0, 0>
    >  const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.is_dynamic_stride(0)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(1)), false);
    BOOST_TEST_EQ((l.is_dynamic_stride(2)), false);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), X);
    BOOST_TEST_EQ((l.stride(2)), X * Y);

    BOOST_TEST_EQ((l.size()), X * Y * Z);
    BOOST_TEST_EQ((l.span()), X * Y * Z);

    tuple<int, int, int> dptr[X * Y * Z];

    // Set all elements to a unique value.
    for (auto k = 0; k < l[2]; ++k)
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (i) + (l[0]) * (j) + (l[0]) * (l[1]) * (k);

        BOOST_TEST_EQ((l.index(i, j, k)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j, k)]), &(dptr[true_idx])); 

        std::get<0>(dptr[l.index(i, j, k)]) = i;
        std::get<1>(dptr[l.index(i, j, k)]) = j;
        std::get<2>(dptr[l.index(i, j, k)]) = k;

        BOOST_TEST_EQ((std::get<0>(dptr[l.index(i, j, k)])), i); 
        BOOST_TEST_EQ((std::get<1>(dptr[l.index(i, j, k)])), j); 
        BOOST_TEST_EQ((std::get<2>(dptr[l.index(i, j, k)])), k); 
    }
}